

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O2

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::delete_min(BinaryHeap<Liby::WeakTimerHolder> *this)

{
  uint uVar1;
  pointer pWVar2;
  undefined8 uVar3;
  WeakTimerHolder local_58;
  
  uVar1 = this->size_;
  if ((ulong)uVar1 != 0) {
    this->size_ = uVar1 - 1;
    pWVar2 = (this->heap).
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
             _M_impl.super__Vector_impl_data._M_start;
    WeakTimerHolder::operator=(pWVar2 + 1,pWVar2 + uVar1);
    percolate_down(this,1);
    local_58.timer_.handler_._M_invoker = (_Invoker_type)0x0;
    local_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.timer_.handler_.super__Function_base._M_functor._8_8_ = 0;
    local_58.timer_.handler_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_58.timer_.timeout_.tv_.tv_usec = 0;
    local_58.timer_.handler_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_58.timer_.id_ = 0;
    local_58.timer_.timeout_.tv_.tv_sec = 0;
    local_58.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    WeakTimerHolder::operator=
              ((this->heap).
               super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
               _M_impl.super__Vector_impl_data._M_start + (this->size_ + 1),&local_58);
    WeakTimerHolder::~WeakTimerHolder(&local_58);
    return;
  }
  uVar3 = __cxa_rethrow();
  WeakTimerHolder::~WeakTimerHolder(&local_58);
  _Unwind_Resume(uVar3);
}

Assistant:

bool empty() const { return size_ == 0; }